

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O3

Ref<anurbs::BrepLoop> __thiscall
anurbs::Model::replace<anurbs::BrepLoop>(Model *this,size_t index,Pointer<anurbs::BrepLoop> *data)

{
  long lVar1;
  pointer psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Pointer<anurbs::BrepLoop> *pPVar3;
  invalid_argument *this_01;
  long *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  Ref<anurbs::BrepLoop> RVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*in_RCX;
  if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_01,"Data is null");
    __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  lVar1 = *(long *)index;
  pPVar3 = (Pointer<anurbs::BrepLoop> *)(*(long *)(index + 8) - lVar1 >> 4);
  if (pPVar3 <= data) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",data,
               pPVar3);
  }
  psVar2 = *(pointer *)(lVar1 + (long)data * 0x10);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 8 + (long)data * 0x10);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*in_RCX;
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RCX[1];
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
    }
  }
  psVar2[2].super___shared_ptr<anurbs::EntryBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var5;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(psVar2 + 3),&local_20);
  _Var4._M_pi = extraout_RDX;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
    _Var4._M_pi = extraout_RDX_00;
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->m_entries).
    super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar2;
    (this->m_entries).
    super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    goto LAB_0020932f;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    bVar6 = __libc_single_threaded != '\0';
    (this->m_entries).
    super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar2;
    (this->m_entries).
    super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)this_00;
    if (bVar6) goto LAB_0020931b;
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
    (this->m_entries).
    super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar2;
    (this->m_entries).
    super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)this_00;
LAB_0020931b:
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  _Var4._M_pi = extraout_RDX_01;
LAB_0020932f:
  RVar7.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  RVar7.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::BrepLoop>)
         RVar7.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ref<TData> replace(size_t index, Pointer<TData> data)
    {
        if (data == nullptr) {
            throw std::invalid_argument("Data is null");
        }

        auto entry = std::static_pointer_cast<Entry<TData>>(
            m_entries.at(index));
        
        entry->set_data(data);

        return Ref<TData>(entry);
    }